

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O0

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
duckdb::CollateExpression::Deserialize(Deserializer *deserializer)

{
  pointer pCVar1;
  Deserializer *in_RSI;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> in_RDI;
  unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true> result
  ;
  pointer in_stack_ffffffffffffff98;
  Deserializer *pDVar2;
  CollateExpression *in_stack_ffffffffffffffa0;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *ret;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  field_id_t in_stack_ffffffffffffffee;
  Deserializer *this_00;
  
  this._M_head_impl =
       (ParsedExpression *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  operator_new(0x60);
  CollateExpression(in_stack_ffffffffffffffa0);
  ret = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *
        )&stack0xffffffffffffffe8;
  unique_ptr<duckdb::CollateExpression,std::default_delete<duckdb::CollateExpression>,true>::
  unique_ptr<std::default_delete<duckdb::CollateExpression>,void>
            ((unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
              *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pDVar2 = in_RSI;
  pCVar1 = unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
           ::operator->((unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
                         *)in_stack_ffffffffffffffa0);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((Deserializer *)this._M_head_impl,(field_id_t)((ulong)pCVar1 >> 0x30),(char *)in_RSI,
             ret);
  this_00 = pDVar2;
  pCVar1 = unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
           ::operator->((unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
                         *)in_stack_ffffffffffffffa0);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (this_00,in_stack_ffffffffffffffee,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
  unique_ptr<duckdb::CollateExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
            ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)pCVar1,
             (unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>_>
              *)pDVar2);
  unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
               *)0xade32a);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> CollateExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CollateExpression>(new CollateExpression());
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "child", result->child);
	deserializer.ReadPropertyWithDefault<string>(201, "collation", result->collation);
	return std::move(result);
}